

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O3

void __thiscall CorUnix::CPalThread::CPalThread(CPalThread *this)

{
  this->_vptr_CPalThread = (_func_int **)&PTR__CPalThread_00357b08;
  this->m_pNext = (CPalThread *)0x0;
  this->m_dwExitCode = 0x103;
  this->m_fExitCodeSet = 0;
  this->m_fLockInitialized = false;
  this->m_fIsDummy = false;
  this->m_lRefCount = 1;
  this->m_pThreadObject = (IPalObject *)0x0;
  this->m_threadId = 0;
  this->m_dwLwpId = 0;
  this->m_pthreadSelf = 0;
  this->m_hardwareExceptionHolderCount = 0;
  this->m_lpStartAddress = (LPTHREAD_START_ROUTINE)0x0;
  this->m_lpStartParameter = (LPVOID)0x0;
  this->m_bCreateSuspended = 0;
  this->m_iThreadPriority = 0;
  this->m_eThreadType = UserCreatedThread;
  this->m_fStartItemsInitialized = false;
  this->m_fStartStatus = false;
  this->m_fStartStatusSet = false;
  this->m_stackBase = (void *)0x0;
  this->m_stackLimit = (void *)0x0;
  this->m_fInPal = true;
  CThreadSynchronizationInfo::CThreadSynchronizationInfo(&this->synchronizationInfo);
  (this->suspensionInfo).super_CThreadInfoInitializer._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_00357be0;
  (this->suspensionInfo).m_fPending = 0;
  (this->suspensionInfo).m_fSelfsusp = 0;
  (this->suspensionInfo).m_fSuspendedForShutdown = 0;
  (this->suspensionInfo).m_nBlockingPipe = -1;
  (this->suspensionInfo).m_lNumThreadsSuspendedByThisThread.m_val = 0;
  (this->suspensionInfo).m_fSuspmutexInitialized = 0;
  (this->suspensionInfo).m_fSemaphoresInitialized = 0;
  CThreadSuspensionInfo::InitializeSuspensionLock(&this->suspensionInfo);
  (this->sehInfo).super_CThreadInfoInitializer._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_00357b38;
  (this->apcInfo).super_CThreadInfoInitializer._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_00357b70;
  (this->apcInfo).m_ptainHead = (PThreadApcInfoNode)0x0;
  (this->apcInfo).m_ptainTail = (PThreadApcInfoNode)0x0;
  CThreadCRTInfo::CThreadCRTInfo(&this->crtInfo);
  return;
}

Assistant:

CPalThread()
            :
            m_pNext(NULL),
            m_dwExitCode(STILL_ACTIVE),
            m_fExitCodeSet(FALSE),
            m_fLockInitialized(FALSE),
            m_fIsDummy(FALSE),
            m_lRefCount(1),
            m_pThreadObject(NULL),
            m_threadId(0),
            m_dwLwpId(0),
            m_pthreadSelf(0),
#if HAVE_MACH_THREADS
            m_machPortSelf(0),
#endif
            m_hardwareExceptionHolderCount(0),
            m_lpStartAddress(NULL),
            m_lpStartParameter(NULL),
            m_bCreateSuspended(FALSE),
            m_iThreadPriority(THREAD_PRIORITY_NORMAL),
            m_eThreadType(UserCreatedThread),
            m_fStartItemsInitialized(FALSE),
            m_fStartStatus(FALSE),
            m_fStartStatusSet(FALSE),
            m_stackBase(NULL),
            m_stackLimit(NULL)
#ifdef FEATURE_PAL_SXS
          , m_fInPal(TRUE)
#endif // FEATURE_PAL_SXS
        {
        }